

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O1

void duckdb::MergeUpdateLoop<duckdb::interval_t>
               (UpdateInfo *base_info,Vector *base_data,UpdateInfo *update_info,
               UnifiedVectorFormat *update,row_t *ids,idx_t count,SelectionVector *sel)

{
  UpdateInfo *__dest;
  undefined8 *puVar1;
  void *__dest_00;
  uint uVar2;
  uint uVar3;
  SelectionVector *pSVar4;
  data_ptr_t pdVar5;
  data_ptr_t pdVar6;
  sel_t *psVar7;
  sel_t *psVar8;
  row_t rVar9;
  undefined8 uVar10;
  void *__dest_01;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  undefined8 *puVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  bool bVar25;
  sel_t result_ids [2048];
  interval_t result_values [2048];
  uint local_a038 [2048];
  undefined8 local_8038 [4097];
  
  pSVar4 = update->sel;
  pdVar5 = update->data;
  lVar15 = base_info->vector_index * 0x800 + base_info->segment->column_data->start;
  __dest = base_info + 1;
  uVar2 = base_info->max;
  __dest_00 = (void *)((long)&base_info[1].segment + (ulong)uVar2 * 4);
  __dest_01 = (void *)((long)&update_info[1].segment + (ulong)update_info->max * 4);
  lVar16 = (ulong)update_info->max * 4;
  if (count == 0) {
    lVar19 = 0;
    uVar23 = 0;
  }
  else {
    pdVar6 = base_data->data;
    psVar7 = sel->sel_vector;
    uVar20 = (ulong)update_info->N;
    uVar22 = (ulong)base_info->N;
    uVar23 = 0;
    uVar17 = 0;
    lVar19 = 0;
    uVar14 = 0;
    do {
      uVar11 = uVar17;
      if (psVar7 != (sel_t *)0x0) {
        uVar11 = (ulong)psVar7[uVar17];
      }
      uVar21 = ids[uVar11] - lVar15;
      bVar25 = uVar23 < uVar20;
      uVar11 = uVar14;
      if (bVar25) {
        uVar13 = (ulong)*(uint *)((long)&update_info[1].segment + uVar23 * 4);
        if (uVar13 < uVar21) {
          lVar12 = 0;
          lVar24 = 0;
          do {
            puVar18 = (undefined8 *)
                      ((long)&update_info[1].segment + lVar24 + uVar23 * 0x10 + lVar16);
            uVar10 = puVar18[1];
            puVar1 = (undefined8 *)((long)local_8038 + lVar24 + lVar19 * 0x10);
            *puVar1 = *puVar18;
            puVar1[1] = uVar10;
            local_a038[lVar19 + lVar12] = (uint)uVar13;
            if ((1 - uVar20) + uVar23 + lVar12 == 0) {
              lVar19 = lVar19 + lVar12 + 1;
              uVar23 = uVar23 + 1 + lVar12;
              goto LAB_011193b9;
            }
            uVar13 = (ulong)*(uint *)((long)&update_info[1].segment + lVar12 * 4 + uVar23 * 4 + 4);
            lVar24 = lVar24 + 0x10;
            lVar12 = lVar12 + 1;
          } while (uVar13 < uVar21);
          uVar23 = uVar23 + lVar12;
          bVar25 = uVar23 < uVar20;
          lVar19 = lVar19 + lVar12;
        }
        if ((!bVar25) || (uVar21 != uVar13)) goto LAB_011193b9;
        puVar18 = (undefined8 *)((long)__dest_01 + uVar23 * 0x10);
        uVar10 = puVar18[1];
        local_8038[lVar19 * 2] = *puVar18;
        local_8038[lVar19 * 2 + 1] = uVar10;
        local_a038[lVar19] = (uint)uVar13;
        uVar23 = uVar23 + 1;
      }
      else {
LAB_011193b9:
        bVar25 = uVar14 < uVar22;
        if (bVar25) {
          uVar13 = (ulong)*(uint *)((long)&__dest->segment + uVar14 * 4);
          if (uVar13 < uVar21) {
            do {
              uVar11 = uVar22;
              if (uVar22 - 1 == uVar14) goto LAB_0111940f;
              uVar13 = (ulong)*(uint *)((long)&base_info[1].segment + uVar14 * 4 + 4);
              uVar14 = uVar14 + 1;
            } while (uVar13 < uVar21);
            bVar25 = uVar14 < uVar22;
          }
          uVar11 = uVar14;
          if ((!bVar25) || (uVar21 != uVar13)) goto LAB_0111940f;
          puVar18 = (undefined8 *)((long)__dest_00 + uVar14 * 0x10);
          uVar10 = puVar18[1];
          local_8038[lVar19 * 2] = *puVar18;
          local_8038[lVar19 * 2 + 1] = uVar10;
        }
        else {
LAB_0111940f:
          uVar10 = *(undefined8 *)(pdVar6 + uVar21 * 0x10 + 8);
          local_8038[lVar19 * 2] = *(undefined8 *)(pdVar6 + uVar21 * 0x10);
          local_8038[lVar19 * 2 + 1] = uVar10;
        }
        local_a038[lVar19] = (uint)uVar21;
      }
      lVar19 = lVar19 + 1;
      uVar17 = uVar17 + 1;
      uVar14 = uVar11;
    } while (uVar17 != count);
  }
  uVar14 = (ulong)update_info->N;
  lVar12 = uVar14 - uVar23;
  if (uVar23 <= uVar14 && lVar12 != 0) {
    switchD_015ff80e::default
              (local_a038 + lVar19,(void *)((long)&update_info[1].segment + uVar23 * 4),lVar12 * 4);
    switchD_015ff80e::default
              (local_8038 + lVar19 * 2,
               (void *)((long)&update_info[1].segment + lVar16 + uVar23 * 0x10),lVar12 * 0x10);
    lVar19 = (lVar19 - uVar23) + uVar14;
  }
  update_info->N = (sel_t)lVar19;
  puVar18 = local_8038;
  switchD_015ff80e::default(__dest_01,puVar18,lVar19 << 4);
  switchD_015ff80e::default(update_info + 1,local_a038,lVar19 << 2);
  uVar23 = (ulong)base_info->N;
  if (count == 0 || uVar23 == 0) {
    lVar16 = 0;
    uVar20 = 0;
    uVar14 = 0;
  }
  else {
    psVar7 = sel->sel_vector;
    psVar8 = pSVar4->sel_vector;
    lVar16 = 0;
    uVar14 = 0;
    uVar20 = 0;
    do {
      uVar17 = uVar14;
      if (psVar7 != (sel_t *)0x0) {
        uVar17 = (ulong)psVar7[uVar14];
      }
      uVar22 = ids[uVar17] - lVar15;
      uVar3 = *(uint *)((long)&__dest->segment + uVar20 * 4);
      if (uVar22 == uVar3) {
        if (psVar8 != (sel_t *)0x0) {
          uVar17 = (ulong)psVar8[uVar17];
        }
        uVar10 = *(undefined8 *)(pdVar5 + uVar17 * 0x10 + 8);
        *puVar18 = *(undefined8 *)(pdVar5 + uVar17 * 0x10);
        puVar18[1] = uVar10;
        local_a038[lVar16] = (uint)uVar22;
        uVar14 = uVar14 + 1;
LAB_011195b1:
        uVar20 = uVar20 + 1;
      }
      else {
        if (uVar3 <= uVar22) {
          puVar1 = (undefined8 *)((long)__dest_00 + uVar20 * 0x10);
          uVar10 = puVar1[1];
          *puVar18 = *puVar1;
          puVar18[1] = uVar10;
          local_a038[lVar16] = uVar3;
          goto LAB_011195b1;
        }
        if (psVar8 != (sel_t *)0x0) {
          uVar17 = (ulong)psVar8[uVar17];
        }
        uVar10 = *(undefined8 *)(pdVar5 + uVar17 * 0x10 + 8);
        *puVar18 = *(undefined8 *)(pdVar5 + uVar17 * 0x10);
        puVar18[1] = uVar10;
        local_a038[lVar16] = (uint)uVar22;
        uVar14 = uVar14 + 1;
      }
      lVar16 = lVar16 + 1;
    } while ((uVar14 < count) && (puVar18 = puVar18 + 2, uVar20 < uVar23));
  }
  if (uVar14 < count) {
    psVar7 = sel->sel_vector;
    psVar8 = pSVar4->sel_vector;
    puVar18 = local_8038 + lVar16 * 2;
    do {
      uVar17 = uVar14;
      if (psVar7 != (sel_t *)0x0) {
        uVar17 = (ulong)psVar7[uVar14];
      }
      uVar22 = uVar17;
      if (psVar8 != (sel_t *)0x0) {
        uVar22 = (ulong)psVar8[uVar17];
      }
      rVar9 = ids[uVar17];
      uVar10 = *(undefined8 *)(pdVar5 + uVar22 * 0x10 + 8);
      *puVar18 = *(undefined8 *)(pdVar5 + uVar22 * 0x10);
      puVar18[1] = uVar10;
      local_a038[lVar16] = (int)rVar9 - (int)lVar15;
      lVar16 = lVar16 + 1;
      uVar14 = uVar14 + 1;
      puVar18 = puVar18 + 2;
    } while (count != uVar14);
  }
  lVar15 = uVar23 - uVar20;
  if (uVar20 <= uVar23 && lVar15 != 0) {
    switchD_015ff80e::default
              (local_a038 + lVar16,(void *)((long)&base_info[1].segment + uVar20 * 4),lVar15 * 4);
    switchD_015ff80e::default
              (local_8038 + lVar16 * 2,
               (void *)((long)&base_info[1].segment + (ulong)uVar2 * 4 + uVar20 * 0x10),
               lVar15 * 0x10);
    lVar16 = lVar16 + lVar15;
  }
  base_info->N = (sel_t)lVar16;
  switchD_015ff80e::default(__dest_00,local_8038,lVar16 << 4);
  switchD_015ff80e::default(__dest,local_a038,lVar16 << 2);
  return;
}

Assistant:

static void MergeUpdateLoop(UpdateInfo &base_info, Vector &base_data, UpdateInfo &update_info,
                            UnifiedVectorFormat &update, row_t *ids, idx_t count, const SelectionVector &sel) {
	auto base_table_data = FlatVector::GetData<T>(base_data);
	auto update_vector_data = update.GetData<T>(update);
	MergeUpdateLoopInternal<T, T>(base_info, base_table_data, update_info, *update.sel, update_vector_data, ids, count,
	                              sel);
}